

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::AddCapability(IRContext *this,Capability capability)

{
  bool bVar1;
  FeatureManager *pFVar2;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  Capability local_b4;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b0;
  undefined4 local_a8 [2];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pFVar2 = get_feature_mgr(this);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,capability);
  if (!bVar1) {
    this_00 = (Instruction *)operator_new(0x70);
    init_list._M_len = 1;
    init_list._M_array = &local_b4;
    local_b4 = capability;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_a8[0] = 0x21;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
               local_a8,&local_78);
    Instruction::Instruction(this_00,this,OpCapability,0,0,(OperandList *)&local_78);
    local_b0._M_head_impl = this_00;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    AddCapability(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)&local_b0);
    if (local_b0._M_head_impl != (Instruction *)0x0) {
      (*((local_b0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return;
}

Assistant:

void IRContext::AddCapability(spv::Capability capability) {
  if (!get_feature_mgr()->HasCapability(capability)) {
    std::unique_ptr<Instruction> capability_inst(new Instruction(
        this, spv::Op::OpCapability, 0, 0,
        {{SPV_OPERAND_TYPE_CAPABILITY, {static_cast<uint32_t>(capability)}}}));
    AddCapability(std::move(capability_inst));
  }
}